

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::OwnFd> * __thiscall
kj::_::ExceptionOr<kj::OwnFd>::operator=
          (ExceptionOr<kj::OwnFd> *this,ExceptionOr<kj::OwnFd> *param_1)

{
  ExceptionOr<kj::OwnFd> *param_1_local;
  ExceptionOr<kj::OwnFd> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::OwnFd>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;